

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_connect(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  int iVar1;
  tftp_state_data_t *state_00;
  uchar *puVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int local_2c;
  int rc;
  int blksize;
  tftp_state_data_t *state;
  _Bool *done_local;
  connectdata *conn_local;
  
  local_2c = 0x200;
  auVar5 = (undefined1  [16])(*Curl_ccalloc)(1,0x170);
  state_00 = auVar5._0_8_;
  (conn->proto).tftpc = state_00;
  if (state_00 == (tftp_state_data_t *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else if (((conn->data->set).tftp_blksize == 0) ||
          ((local_2c = (int)(conn->data->set).tftp_blksize, local_2c < 0xffb9 && (7 < local_2c)))) {
    if ((state_00->rpacket).data == (uchar *)0x0) {
      auVar5 = (undefined1  [16])(*Curl_ccalloc)(1,(long)(local_2c + 4));
      (state_00->rpacket).data = auVar5._0_8_;
      if ((state_00->rpacket).data == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((state_00->spacket).data == (uchar *)0x0) {
      puVar2 = (uchar *)(*Curl_ccalloc)(1,(long)(local_2c + 4));
      (state_00->spacket).data = puVar2;
      if ((state_00->spacket).data == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_conncontrol(conn,1);
    state_00->conn = conn;
    state_00->sockfd = state_00->conn->sock[0];
    state_00->state = TFTP_STATE_START;
    state_00->error = TFTP_ERR_NONE;
    state_00->blksize = 0x200;
    state_00->requested_blksize = local_2c;
    (state_00->local_addr).buffer.sa.sa_family = (sa_family_t)conn->ip_addr->ai_family;
    tftp_set_timeouts(state_00);
    if (((conn->bits).bound & 1U) == 0) {
      iVar1 = bind(state_00->sockfd,(sockaddr *)&state_00->local_addr,conn->ip_addr->ai_addrlen);
      if (iVar1 != 0) {
        data = conn->data;
        piVar3 = __errno_location();
        pcVar4 = Curl_strerror(conn,*piVar3);
        Curl_failf(data,"bind() failed; %s",pcVar4);
        return CURLE_COULDNT_CONNECT;
      }
      (conn->bits).bound = true;
    }
    Curl_pgrsStartNow(conn->data);
    *done = true;
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    conn_local._4_4_ = CURLE_TFTP_ILLEGAL;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode tftp_connect(struct connectdata *conn, bool *done)
{
  tftp_state_data_t *state;
  int blksize;

  blksize = TFTP_BLKSIZE_DEFAULT;

  state = conn->proto.tftpc = calloc(1, sizeof(tftp_state_data_t));
  if(!state)
    return CURLE_OUT_OF_MEMORY;

  /* alloc pkt buffers based on specified blksize */
  if(conn->data->set.tftp_blksize) {
    blksize = (int)conn->data->set.tftp_blksize;
    if(blksize > TFTP_BLKSIZE_MAX || blksize < TFTP_BLKSIZE_MIN)
      return CURLE_TFTP_ILLEGAL;
  }

  if(!state->rpacket.data) {
    state->rpacket.data = calloc(1, blksize + 2 + 2);

    if(!state->rpacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!state->spacket.data) {
    state->spacket.data = calloc(1, blksize + 2 + 2);

    if(!state->spacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  /* we don't keep TFTP connections up basically because there's none or very
   * little gain for UDP */
  connclose(conn, "TFTP");

  state->conn = conn;
  state->sockfd = state->conn->sock[FIRSTSOCKET];
  state->state = TFTP_STATE_START;
  state->error = TFTP_ERR_NONE;
  state->blksize = TFTP_BLKSIZE_DEFAULT;
  state->requested_blksize = blksize;

  ((struct sockaddr *)&state->local_addr)->sa_family =
    (CURL_SA_FAMILY_T)(conn->ip_addr->ai_family);

  tftp_set_timeouts(state);

  if(!conn->bits.bound) {
    /* If not already bound, bind to any interface, random UDP port. If it is
     * reused or a custom local port was desired, this has already been done!
     *
     * We once used the size of the local_addr struct as the third argument
     * for bind() to better work with IPv6 or whatever size the struct could
     * have, but we learned that at least Tru64, AIX and IRIX *requires* the
     * size of that argument to match the exact size of a 'sockaddr_in' struct
     * when running IPv4-only.
     *
     * Therefore we use the size from the address we connected to, which we
     * assume uses the same IP version and thus hopefully this works for both
     * IPv4 and IPv6...
     */
    int rc = bind(state->sockfd, (struct sockaddr *)&state->local_addr,
                  conn->ip_addr->ai_addrlen);
    if(rc) {
      failf(conn->data, "bind() failed; %s",
            Curl_strerror(conn, SOCKERRNO));
      return CURLE_COULDNT_CONNECT;
    }
    conn->bits.bound = TRUE;
  }

  Curl_pgrsStartNow(conn->data);

  *done = TRUE;

  return CURLE_OK;
}